

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URITest.cpp
# Opt level: O3

void __thiscall
jaegertracing::net::URI_testParseQueryValues_Test::~URI_testParseQueryValues_Test
          (URI_testParseQueryValues_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(URI, testParseQueryValues)
{
    {
        const auto uri = URI::parse(
            "http://example.com?test1=1&test2=%6F&test2=r&test3&test4");
        const auto values = uri.parseQueryValues();
        ASSERT_EQ(5, values.size());

        const auto test1 = values.equal_range("test1");
        ASSERT_EQ(1, std::distance(test1.first, test1.second));
        ASSERT_EQ("test1", test1.first->first);
        ASSERT_EQ("1", test1.first->second);

        const auto test2 = values.equal_range("test2");
        ASSERT_EQ(2, std::distance(test2.first, test2.second));
        auto test2Itr = test2.first;
        ASSERT_EQ("test2", test2Itr->first);
        ASSERT_TRUE(test2Itr->second == "o" || test2Itr->second == "r");
        auto nextTest2Value = (test2Itr->second == "o") ? "r" : "o";
        ++test2Itr;
        ASSERT_EQ("test2", test2Itr->first);
        ASSERT_EQ(nextTest2Value, test2Itr->second);

        const auto test3 = values.equal_range("test3");
        ASSERT_EQ(1, std::distance(test3.first, test3.second));
        ASSERT_EQ("test3", test3.first->first);
        ASSERT_TRUE(test3.first->second.empty());

        const auto test4 = values.equal_range("test4");
        ASSERT_EQ(1, std::distance(test4.first, test4.second));
        ASSERT_EQ("test4", test4.first->first);
        ASSERT_TRUE(test4.first->second.empty());
    }

    ASSERT_TRUE(URI::parse("http://example.com").parseQueryValues().empty());

    {
        const auto uri = URI::parse("http://example.com?key=value");
        const auto values = uri.parseQueryValues();
        ASSERT_EQ(1, values.size());
        ASSERT_EQ("key", std::begin(values)->first);
        ASSERT_EQ("value", std::begin(values)->second);
    }
}